

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_steam.cpp
# Opt level: O0

bool PSR_FindAndEnterBlock(FScanner *sc,char *keyword)

{
  bool bVar1;
  char *keyword_local;
  FScanner *sc_local;
  
  while( true ) {
    bVar1 = FScanner::GetToken(sc);
    if (!bVar1) {
      return false;
    }
    if (sc->TokenType == 0x7d) break;
    FScanner::TokenMustBe(sc,0x102);
    bVar1 = FScanner::Compare(sc,keyword);
    if (bVar1) {
      FScanner::MustGetToken(sc,0x7b);
      return true;
    }
    bVar1 = FScanner::CheckToken(sc,0x102);
    if (!bVar1) {
      PSR_SkipBlock(sc);
    }
  }
  FScanner::UnGet(sc);
  return false;
}

Assistant:

static bool PSR_FindAndEnterBlock(FScanner &sc, const char* keyword)
{
	// Finds a block with a given keyword and then enter it (opening brace)
	// Should be closed with PSR_FindEndBlock
	while(sc.GetToken())
	{
		if(sc.TokenType == '}')
		{
			sc.UnGet();
			return false;
		}

		sc.TokenMustBe(TK_StringConst);
		if(!sc.Compare(keyword))
		{
			if(!sc.CheckToken(TK_StringConst))
				PSR_SkipBlock(sc);
		}
		else
		{
			sc.MustGetToken('{');
			return true;
		}
	}
	return false;
}